

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

bool __thiscall crnlib::command_line_params::is_param(command_line_params *this,uint index)

{
  dynamic_string *pdVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (index < (this->m_params).m_size) {
    pdVar1 = (this->m_params).m_p;
    if (1 < pdVar1[index].m_len) {
      pcVar2 = pdVar1[index].m_pStr;
      pcVar3 = "";
      if (pcVar2 != (char *)0x0) {
        pcVar3 = pcVar2;
      }
      return *pcVar3 == '-';
    }
  }
  return false;
}

Assistant:

bool command_line_params::is_param(uint index) const
    {
        CRNLIB_ASSERT(index < m_params.size());
        if (index >= m_params.size())
        {
            return false;
        }

        const dynamic_string& w = m_params[index];
        if (w.is_empty())
        {
            return false;
        }

#if CRNLIB_CMD_LINE_ALLOW_SLASH_PARAMS
        return (w.get_len() >= 2) && ((w[0] == '-') || (w[0] == '/'));
#else
        return (w.get_len() >= 2) && (w[0] == '-');
#endif
    }